

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O3

int crnlib::MatchFinder_Create
              (CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,UInt32 matchMaxLen,
              UInt32 keepAddBufferAfter,ISzAlloc *alloc)

{
  Byte *pBVar1;
  CLzRef *pCVar2;
  int iVar3;
  UInt32 UVar4;
  uint uVar5;
  uint uVar6;
  UInt32 UVar7;
  uint uVar8;
  UInt32 UVar9;
  
  if (historySize < 0xc0000001) {
    UVar7 = keepAddBufferAfter + matchMaxLen;
    UVar4 = keepAddBufferBefore + historySize + 1;
    p->keepSizeBefore = UVar4;
    p->keepSizeAfter = UVar7;
    uVar8 = (UVar7 + keepAddBufferBefore >> 1) +
            UVar7 + UVar4 + (historySize >> (2U - (historySize < 0x80000001) & 0x1f)) + 0x80000;
    if (p->directInput == 0) {
      if ((p->bufferBase == (Byte *)0x0) || (p->blockSize != uVar8)) {
        (*alloc->Free)(alloc,p->bufferBase);
        p->bufferBase = (Byte *)0x0;
        p->blockSize = uVar8;
        pBVar1 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar8);
        p->bufferBase = pBVar1;
        if (pBVar1 == (Byte *)0x0) goto LAB_001a4ecb;
      }
    }
    else {
      p->blockSize = uVar8;
    }
    p->matchMaxLen = matchMaxLen;
    p->fixedHashSize = 0;
    uVar8 = p->numHashBytes;
    if (uVar8 == 2) {
      p->hashMask = 0xffff;
      iVar3 = 0x10000;
      uVar6 = 0;
    }
    else {
      uVar5 = historySize - 1 >> 1 | historySize - 1;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar6 = uVar5 >> 1 | uVar5 >> 9 | 0xffff;
      uVar5 = 0xffffff;
      if (uVar8 != 3) {
        uVar5 = uVar6 >> 1;
      }
      if (uVar6 < 0x1000001) {
        uVar5 = uVar6;
      }
      iVar3 = uVar5 + 1;
      uVar6 = 0;
      p->hashMask = uVar5;
      if (2 < uVar8) {
        p->fixedHashSize = 0x400;
        uVar6 = 0x400;
        if (uVar8 != 3) {
          uVar6 = (uint)(4 < uVar8) << 0x14 | 0x10400;
          p->fixedHashSize = uVar6;
        }
      }
    }
    UVar4 = p->numSons;
    p->historySize = historySize;
    UVar7 = p->hashSizeSum;
    p->hashSizeSum = uVar6 + iVar3;
    p->cyclicBufferSize = historySize + 1;
    UVar9 = historySize + 1 << (p->btMode != 0);
    p->numSons = UVar9;
    uVar8 = UVar9 + uVar6 + iVar3;
    if ((p->hash != (CLzRef *)0x0) && (UVar4 + UVar7 == uVar8)) {
      return 1;
    }
    (*alloc->Free)(alloc,p->hash);
    p->hash = (CLzRef *)0x0;
    pCVar2 = (CLzRef *)(*alloc->Alloc)(alloc,(ulong)uVar8 << 2);
    p->hash = pCVar2;
    if (pCVar2 != (CLzRef *)0x0) {
      p->son = pCVar2 + p->hashSizeSum;
      return 1;
    }
    pCVar2 = (CLzRef *)0x0;
  }
  else {
LAB_001a4ecb:
    pCVar2 = p->hash;
  }
  (*alloc->Free)(alloc,pCVar2);
  p->hash = (CLzRef *)0x0;
  if (p->directInput == 0) {
    (*alloc->Free)(alloc,p->bufferBase);
    p->bufferBase = (Byte *)0x0;
  }
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder* p, UInt32 historySize,
                       UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
                       ISzAlloc* alloc) {
  UInt32 sizeReserv;
  if (historySize > kMaxHistorySize) {
    MatchFinder_Free(p, alloc);
    return 0;
  }
  sizeReserv = historySize >> 1;
  if (historySize > ((UInt32)2 << 30))
    sizeReserv = historySize >> 2;
  sizeReserv += (keepAddBufferBefore + matchMaxLen + keepAddBufferAfter) / 2 + (1 << 19);

  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;
  p->keepSizeAfter = matchMaxLen + keepAddBufferAfter;
  /* we need one additional byte, since we use MoveBlock after pos++ and before dictionary using */
  if (LzInWindow_Create(p, sizeReserv, alloc)) {
    UInt32 newCyclicBufferSize = (historySize /* >> p->skipModeBits */) + 1;
    UInt32 hs;
    p->matchMaxLen = matchMaxLen;
    {
      p->fixedHashSize = 0;
      if (p->numHashBytes == 2)
        hs = (1 << 16) - 1;
      else {
        hs = historySize - 1;
        hs |= (hs >> 1);
        hs |= (hs >> 2);
        hs |= (hs >> 4);
        hs |= (hs >> 8);
        hs >>= 1;
        /* hs >>= p->skipModeBits; */
        hs |= 0xFFFF; /* don't change it! It's required for Deflate */
        if (hs > (1 << 24)) {
          if (p->numHashBytes == 3)
            hs = (1 << 24) - 1;
          else
            hs >>= 1;
        }
      }
      p->hashMask = hs;
      hs++;
      if (p->numHashBytes > 2)
        p->fixedHashSize += kHash2Size;
      if (p->numHashBytes > 3)
        p->fixedHashSize += kHash3Size;
      if (p->numHashBytes > 4)
        p->fixedHashSize += kHash4Size;
      hs += p->fixedHashSize;
    }

    {
      UInt32 prevSize = p->hashSizeSum + p->numSons;
      UInt32 newSize;
      p->historySize = historySize;
      p->hashSizeSum = hs;
      p->cyclicBufferSize = newCyclicBufferSize;
      p->numSons = (p->btMode ? newCyclicBufferSize * 2 : newCyclicBufferSize);
      newSize = p->hashSizeSum + p->numSons;
      if (p->hash != 0 && prevSize == newSize)
        return 1;
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->hash = AllocRefs(newSize, alloc);
      if (p->hash != 0) {
        p->son = p->hash + p->hashSizeSum;
        return 1;
      }
    }
  }
  MatchFinder_Free(p, alloc);
  return 0;
}